

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_file.cpp
# Opt level: O0

void libtorrent::aux::copy_file(string *inf,string *newf,storage_error *se)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  error_category *peVar5;
  __off64_t __offset;
  ssize_t sVar6;
  copy_range_mode local_139;
  int local_138;
  int iStack_134;
  copy_range_mode m;
  int err_1;
  int err;
  off_t data_end;
  off_t data_start;
  ssize_t ret;
  file_descriptor local_110;
  copy_range_mode m_1;
  file_descriptor outfd;
  bool input_is_sparse;
  stat in_stat;
  file_descriptor local_70 [2];
  file_descriptor infd;
  undefined1 local_60 [8];
  native_path_string f2;
  native_path_string f1;
  storage_error *se_local;
  string *newf_local;
  string *inf_local;
  
  boost::system::error_code::clear(&se->ec);
  convert_to_native_path_string((native_path_string *)((long)&f2.field_2 + 8),inf);
  convert_to_native_path_string((native_path_string *)local_60,newf);
  pcVar3 = (char *)::std::__cxx11::string::c_str();
  iVar1 = open64(pcVar3,0);
  file_descriptor::file_descriptor(local_70,iVar1);
  iVar1 = file_descriptor::fd(local_70);
  if (iVar1 < 0) {
    se->operation = file_stat;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    peVar5 = boost::system::system_category();
    boost::system::error_code::assign(&se->ec,iVar1,peVar5);
  }
  else {
    iVar1 = file_descriptor::fd(local_70);
    iVar1 = fstat64(iVar1,(stat64 *)&outfd);
    if (iVar1 == 0) {
      m_1.use_fallback = in_stat.st_blksize * 0x200 < (long)in_stat.st_rdev;
      pcVar3 = (char *)::std::__cxx11::string::c_str();
      iVar1 = open64(pcVar3,(m_1.use_fallback & 1) << 9 | 0x42,(ulong)(uint)in_stat.st_nlink);
      file_descriptor::file_descriptor(&local_110,iVar1);
      iVar1 = file_descriptor::fd(&local_110);
      if (iVar1 < 0) {
        se->operation = file_open;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        peVar5 = boost::system::system_category();
        boost::system::error_code::assign(&se->ec,iVar1,peVar5);
      }
      else {
        iVar1 = file_descriptor::fd(&local_110);
        iVar1 = ftruncate64(iVar1,in_stat.st_rdev);
        if (iVar1 < 0) {
          se->operation = file_truncate;
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          peVar5 = boost::system::system_category();
          boost::system::error_code::assign(&se->ec,iVar1,peVar5);
        }
        else if ((m_1.use_fallback & 1U) == 0) {
LAB_00257332:
          anon_unknown_1::copy_range_mode::copy_range_mode(&local_139);
          iVar1 = file_descriptor::fd(local_70);
          iVar2 = file_descriptor::fd(&local_110);
          anon_unknown_1::copy_range(iVar1,iVar2,0,in_stat.st_rdev,&local_139,se);
        }
        else {
          anon_unknown_1::copy_range_mode::copy_range_mode((copy_range_mode *)((long)&ret + 7));
          _err_1 = 0;
          while( true ) {
            iVar1 = file_descriptor::fd(local_70);
            __offset = lseek64(iVar1,_err_1,3);
            if (__offset == -1) {
              piVar4 = __errno_location();
              iVar1 = *piVar4;
              iStack_134 = iVar1;
              if (iVar1 != 6) {
                if (iVar1 == 0x5f) goto LAB_00257332;
                se->operation = file_seek;
                peVar5 = boost::system::system_category();
                boost::system::error_code::assign(&se->ec,iVar1,peVar5);
              }
              goto LAB_00257393;
            }
            iVar1 = file_descriptor::fd(local_70);
            _err_1 = lseek64(iVar1,__offset,4);
            if (_err_1 == 0xffffffffffffffff) break;
            iVar1 = file_descriptor::fd(local_70);
            iVar2 = file_descriptor::fd(&local_110);
            sVar6 = anon_unknown_1::copy_range
                              (iVar1,iVar2,__offset,_err_1 - __offset,
                               (copy_range_mode *)((long)&ret + 7),se);
            if ((sVar6 < 1) || (_err_1 == in_stat.st_rdev)) goto LAB_00257393;
          }
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          local_138 = iVar1;
          if (iVar1 == 0x5f) goto LAB_00257332;
          se->operation = file_seek;
          peVar5 = boost::system::system_category();
          boost::system::error_code::assign(&se->ec,iVar1,peVar5);
        }
      }
LAB_00257393:
      file_descriptor::~file_descriptor(&local_110);
    }
    else {
      se->operation = file_stat;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      peVar5 = boost::system::system_category();
      boost::system::error_code::assign(&se->ec,iVar1,peVar5);
    }
  }
  file_descriptor::~file_descriptor(local_70);
  ::std::__cxx11::string::~string((string *)local_60);
  ::std::__cxx11::string::~string((string *)(f2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void copy_file(std::string const& inf, std::string const& newf, storage_error& se)
{
	se.ec.clear();
	native_path_string f1 = convert_to_native_path_string(inf);
	native_path_string f2 = convert_to_native_path_string(newf);

	aux::file_descriptor const infd = ::open(f1.c_str(), O_RDONLY);
	if (infd.fd() < 0)
	{
		se.operation = operation_t::file_stat;
		se.ec.assign(errno, system_category());
		return;
	}

	struct stat in_stat;
	if (::fstat(infd.fd(), &in_stat) != 0)
	{
		se.operation = operation_t::file_stat;
		se.ec.assign(errno, system_category());
		return;
	}

	bool const input_is_sparse = in_stat.st_size > off_t(in_stat.st_blocks) * 512;

	// if the source file is not sparse we'll end up copying every byte anyway,
	// there's no point in passing O_TRUNC. However, in order to preserve sparse
	// regions, we *do* need to truncate the output file.
	aux::file_descriptor const outfd = ::open(f2.c_str()
		, input_is_sparse ? (O_RDWR | O_CREAT | O_TRUNC) : (O_RDWR | O_CREAT), in_stat.st_mode);
	if (outfd.fd() < 0)
	{
		se.operation = operation_t::file_open;
		se.ec.assign(errno, system_category());
		return;
	}

#if TORRENT_HAS_COPYFILE
	if (!input_is_sparse)
	{
		// the the file isn't sparse use the system copy function (which
		// expands sparse regions)
		// this only works on 10.5
		copyfile_state_t state = copyfile_state_alloc();
		if (fcopyfile(infd.fd(), outfd.fd(), state, COPYFILE_ALL) < 0)
		{
			se.operation = operation_t::file_copy;
			se.ec.assign(errno, system_category());
		}
		copyfile_state_free(state);
		return;
	}
#endif

	if (::ftruncate(outfd.fd(), in_stat.st_size) < 0)
	{
		se.operation = operation_t::file_truncate;
		se.ec.assign(errno, system_category());
		return;
	}

#ifdef SEEK_HOLE
	if (input_is_sparse)
	{
		copy_range_mode m;
		ssize_t ret = 0;
		off_t data_start = 0;
		off_t data_end = 0;
		for (;;)
		{
			data_start = ::lseek(infd.fd(), data_end, SEEK_DATA);
			if (data_start == off_t(-1))
			{
				int const err = errno;
				// if we SEEK_DATA while the file location is past the last
				// non-sparse region (i.e. the file has been truncated without
				// filled in, the end of the file may be a sparse region). In
				// this case there's nothing left to copy, and we're done
				if (err == ENXIO) return;
				// if SEEK_DATA is not supported, fall back to plain copy
				if (err == ENOTSUP) break;
				se.operation = operation_t::file_seek;
				se.ec.assign(err, system_category());
				return;
			}

			data_end = ::lseek(infd.fd(), data_start, SEEK_HOLE);
			if (data_end == off_t(-1))
			{
				int const err = errno;
				if (err == ENOTSUP) break;
				se.operation = operation_t::file_seek;
				se.ec.assign(err, system_category());
				return;
			}

			ret = copy_range(infd.fd(), outfd.fd(), data_start, data_end - data_start, &m, se);
			if (ret <= 0) return;
			if (data_end == in_stat.st_size) return;
		}
	}
#endif

	copy_range_mode m;
	copy_range(infd.fd(), outfd.fd(), 0, in_stat.st_size, &m, se);
}